

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_create_search(REF_INTERP ref_interp)

{
  REF_CELL pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  char *pcVar4;
  int iVar5;
  undefined8 uStack_f0;
  REF_SEARCH ref_search;
  REF_DBL radius;
  REF_NODE local_d0;
  REF_DBL center [3];
  REF_INT nodes [27];
  
  local_d0 = ref_interp->from_grid->node;
  if (ref_interp->from_grid->twod == 0) {
    pRVar1 = ref_interp->from_tet;
    uVar2 = ref_search_create(&ref_search,pRVar1->n);
    if (uVar2 == 0) {
      for (iVar5 = 0; iVar5 < pRVar1->max; iVar5 = iVar5 + 1) {
        RVar3 = ref_cell_nodes(pRVar1,iVar5,nodes);
        if (RVar3 == 0) {
          uVar2 = ref_node_bounding_sphere(local_d0,nodes,4,center,&radius);
          if (uVar2 != 0) {
            pcVar4 = "b";
            uStack_f0 = 0x87;
            goto LAB_0016e840;
          }
          uVar2 = ref_search_insert(ref_search,iVar5,center,ref_interp->search_donor_scale * radius)
          ;
          if (uVar2 != 0) {
            pcVar4 = "ins";
            uStack_f0 = 0x8a;
            goto LAB_0016e840;
          }
        }
      }
      goto LAB_0016e933;
    }
    pcVar4 = "create search";
    uStack_f0 = 0x85;
  }
  else {
    pRVar1 = ref_interp->from_tri;
    uVar2 = ref_search_create(&ref_search,pRVar1->n);
    if (uVar2 == 0) {
      for (iVar5 = 0; iVar5 < pRVar1->max; iVar5 = iVar5 + 1) {
        RVar3 = ref_cell_nodes(pRVar1,iVar5,nodes);
        if (RVar3 == 0) {
          uVar2 = ref_node_bounding_sphere(local_d0,nodes,3,center,&radius);
          if (uVar2 != 0) {
            pcVar4 = "b";
            uStack_f0 = 0x7f;
            goto LAB_0016e840;
          }
          uVar2 = ref_search_insert(ref_search,iVar5,center,ref_interp->search_donor_scale * radius)
          ;
          if (uVar2 != 0) {
            pcVar4 = "ins";
            uStack_f0 = 0x82;
            goto LAB_0016e840;
          }
        }
      }
LAB_0016e933:
      ref_interp->ref_search = ref_search;
      return 0;
    }
    pcVar4 = "create search";
    uStack_f0 = 0x7d;
  }
LAB_0016e840:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
         uStack_f0,"ref_interp_create_search",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_create_search(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_CELL from_tri = ref_interp_from_tri(ref_interp);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius;
  REF_SEARCH ref_search;

  if (ref_grid_twod(from_grid)) {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tri)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tri, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 3, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
  } else {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tet)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tet, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 4, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
  }
  ref_interp_search(ref_interp) = ref_search;

  return REF_SUCCESS;
}